

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O2

EC_KEY * o2i_ECPublicKey(EC_KEY **key,uchar **in,long len)

{
  EC_KEY *pEVar1;
  byte *pbVar2;
  int iVar3;
  EC_POINT *p;
  EC_GROUP *group;
  int line;
  
  if (((key == (EC_KEY **)0x0) || (pEVar1 = *key, pEVar1 == (EC_KEY *)0x0)) ||
     (group = *(EC_GROUP **)pEVar1, group == (EC_GROUP *)0x0)) {
    iVar3 = 0x43;
    line = 0x1fc;
  }
  else {
    p = *(EC_POINT **)(pEVar1 + 8);
    if (p == (EC_POINT *)0x0) {
      p = EC_POINT_new(group);
      *(EC_POINT **)(pEVar1 + 8) = p;
      if (p == (EC_POINT *)0x0) {
        return (EC_KEY *)0x0;
      }
      group = *(EC_GROUP **)pEVar1;
    }
    iVar3 = EC_POINT_oct2point(group,p,*in,len,(BN_CTX *)0x0);
    if (iVar3 != 0) {
      pbVar2 = *in;
      *(uint *)(pEVar1 + 0x1c) = *pbVar2 & 0xfffffffe;
      *in = pbVar2 + len;
      return pEVar1;
    }
    iVar3 = 0xf;
    line = 0x205;
  }
  ERR_put_error(0xf,0,iVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                ,line);
  return (EC_KEY *)0x0;
}

Assistant:

EC_KEY *o2i_ECPublicKey(EC_KEY **keyp, const uint8_t **inp, long len) {
  EC_KEY *ret = NULL;

  if (keyp == NULL || *keyp == NULL || (*keyp)->group == NULL) {
    OPENSSL_PUT_ERROR(EC, ERR_R_PASSED_NULL_PARAMETER);
    return NULL;
  }
  ret = *keyp;
  if (ret->pub_key == NULL &&
      (ret->pub_key = EC_POINT_new(ret->group)) == NULL) {
    return NULL;
  }
  if (!EC_POINT_oct2point(ret->group, ret->pub_key, *inp, len, NULL)) {
    OPENSSL_PUT_ERROR(EC, ERR_R_EC_LIB);
    return NULL;
  }
  // save the point conversion form
  ret->conv_form = (point_conversion_form_t)(*inp[0] & ~0x01);
  *inp += len;
  return ret;
}